

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMLSParserImpl::resolveEntity(DOMLSParserImpl *this)

{
  XMLResourceIdentifier *in_RSI;
  
  resolveEntity((DOMLSParserImpl *)&this[-1].fWrapNodesContext,in_RSI);
  return;
}

Assistant:

InputSource*
DOMLSParserImpl::resolveEntity( XMLResourceIdentifier* resourceIdentifier )
{
    //
    //  Just map it to the SAX entity resolver. If there is not one installed,
    //  return a null pointer to cause the default resolution.
    //
    if (fEntityResolver) {
        DOMLSInput* is = fEntityResolver->resolveResource(resourceIdentifier->getResourceIdentifierType()==XMLResourceIdentifier::ExternalEntity?XMLUni::fgDOMDTDType:XMLUni::fgDOMXMLSchemaType,
                                                          resourceIdentifier->getNameSpace(),
                                                          resourceIdentifier->getPublicId(),
                                                          resourceIdentifier->getSystemId(),
                                                          resourceIdentifier->getBaseURI());
        if (is)
            return new (getMemoryManager()) Wrapper4DOMLSInput(is, fEntityResolver, true, getMemoryManager());
    }
    if (fXMLEntityResolver) {
        return(fXMLEntityResolver->resolveEntity(resourceIdentifier));
    }

    return 0;
}